

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFaultClasses(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVeryVerbose;
  char *pcVar4;
  uint fStuckAt;
  uint local_40;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  Extra_UtilGetoptReset();
  fStuckAt = 0;
  local_40 = 0;
  local_3c = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"gcsvwh"), iVar2 == 0x77) {
        fVeryVerbose = fVeryVerbose ^ 1;
      }
      if (iVar2 < 0x67) break;
      if (iVar2 == 0x76) {
        local_3c = local_3c ^ 1;
      }
      else if (iVar2 == 0x73) {
        local_40 = local_40 ^ 1;
      }
      else {
        if (iVar2 != 0x67) goto LAB_002549fc;
        bVar1 = (bool)(bVar1 ^ 1);
      }
    }
    if (iVar2 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar3 = "Empty network.\n";
      }
      else {
        if (pNtk->ntkType != ABC_NTK_STRASH) {
          if (bVar1) {
            pcVar3 = Extra_FileNameGenericAppend(pNtk->pSpec,"_faults.txt");
            Abc_NtkGenFaultList(pNtk,pcVar3,fStuckAt);
          }
          else {
            Abc_NtkDetectClassesTest(pNtk,local_40,local_3c,fVeryVerbose);
          }
          return 0;
        }
        pcVar3 = "Only applicable to a logic network.\n";
      }
      iVar2 = -1;
      goto LAB_00254b04;
    }
    if (iVar2 != 99) break;
    fStuckAt = fStuckAt ^ 1;
  }
LAB_002549fc:
  Abc_Print(-2,"usage: faultclasses [-gcsvwh]\n");
  Abc_Print(-2,"\t           computes equivalence classes of faults in the given mapped netlist;\n")
  ;
  Abc_Print(-2,
            "\t           the fault list with faults in the format: <fault_id> <node_name> <fault_name>\n"
           );
  Abc_Print(-2,"\t           should be read by command \"read_fins\" before calling this command\n")
  ;
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (!bVar1) {
    pcVar3 = "no";
  }
  Abc_Print(-2,
            "\t-g       : toggle generating a fault list for the current mapped network [default = %s]\n"
            ,pcVar3);
  pcVar3 = "yes";
  if (fStuckAt == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,
            "\t-c       : toggle using only stuck-at faults in the generated fault list [default = %s]\n"
            ,pcVar3);
  pcVar3 = "yes";
  if (local_40 == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s       : toggle detecting sequential equivalence classes [default = %s]\n",
            pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v       : toggle verbose printout during computation [default = %s]\n",pcVar3);
  if (fVeryVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,
            "\t-w       : toggle printing of resulting fault equivalence classes [default = %s]\n",
            pcVar4);
  pcVar3 = "\t-h       : print the command usage\n";
  iVar2 = -2;
LAB_00254b04:
  Abc_Print(iVar2,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandFaultClasses( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose );
    extern void Abc_NtkGenFaultList( Abc_Ntk_t * pNtk, char * pFileName, int fStuckAt );
    Abc_Ntk_t * pNtk;
    int c, fGen = 0, fStuckAt = 0, fSeq = 0, fVerbose = 0, fVeryVerbose = 0;
    pNtk = Abc_FrameReadNtk(pAbc);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "gcsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'g':
            fGen ^= 1;
            break;
        case 'c':
            fStuckAt ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only applicable to a logic network.\n" );
        return 1;
    }
    if ( fGen )
    {
        char * pFileName = Extra_FileNameGenericAppend(Abc_NtkSpec(pNtk), "_faults.txt");
        Abc_NtkGenFaultList( pNtk, pFileName, fStuckAt );
    }
    else
        Abc_NtkDetectClassesTest( pNtk, fSeq, fVerbose, fVeryVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: faultclasses [-gcsvwh]\n" );
    Abc_Print( -2, "\t           computes equivalence classes of faults in the given mapped netlist;\n" );
    Abc_Print( -2, "\t           the fault list with faults in the format: <fault_id> <node_name> <fault_name>\n" );
    Abc_Print( -2, "\t           should be read by command \"read_fins\" before calling this command\n" );
    Abc_Print( -2, "\t-g       : toggle generating a fault list for the current mapped network [default = %s]\n", fGen? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle using only stuck-at faults in the generated fault list [default = %s]\n", fStuckAt? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle detecting sequential equivalence classes [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout during computation [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing of resulting fault equivalence classes [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}